

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  TPZRegisterClassId *in_RDI;
  int i;
  TPZGeoEl *in_stack_000001d8;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_000001e0;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  TPZVec<long> *in_stack_ffffffffffffff68;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *in_stack_ffffffffffffff70;
  TPZRegisterClassId *local_80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02468f30);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->_vptr_TPZVec,
                     in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                     (int64_t *)in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468c18;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468c18;
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_80 = in_RDI + 0xae8;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_80 = local_80 + 0x18;
  } while (local_80 != in_RDI + 0xbc0);
  for (local_48 = 0; local_48 < 9; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_48 * 0x18 + 0xae8),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x17bf688);
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::Initialize(in_stack_000001e0,in_stack_000001d8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}